

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnalyzedAssertion.cpp
# Opt level: O3

VisitResult * __thiscall
slang::analysis::ClockVisitor::visit
          (VisitResult *__return_storage_ptr__,ClockVisitor *this,CaseAssertionExpr *expr,
          Clock outerClock,bitmask<slang::analysis::VisitFlags> flags)

{
  size_t sVar1;
  pointer pIVar2;
  CaseAssertionExpr *expr_00;
  VisitResult *pVVar3;
  long lVar4;
  bitmask<slang::analysis::VisitFlags> local_bc;
  Clock local_b8;
  CaseAssertionExpr *local_b0;
  VisitResult *local_a8;
  VisitResult local_a0;
  VisitResult local_68;
  
  sVar1 = (expr->items)._M_extent._M_extent_value;
  local_bc.m_bits = flags.m_bits;
  local_b8 = outerClock;
  local_b0 = expr;
  local_a8 = __return_storage_ptr__;
  if (sVar1 != 0) {
    pIVar2 = (expr->items)._M_ptr;
    lVar4 = 0;
    do {
      ast::AssertionExpr::
      visit<slang::analysis::ClockVisitor,slang::ast::TimingControl_const*&,slang::bitmask<slang::analysis::VisitFlags>&>
                (&local_a0,*(AssertionExpr **)((long)&(pIVar2->body).ptr + lVar4),this,&local_b8,
                 &local_bc);
      if (local_a0.clocks.super_SmallVectorBase<const_slang::ast::TimingControl_*>.data_ !=
          (pointer)local_a0.clocks.super_SmallVectorBase<const_slang::ast::TimingControl_*>.
                   firstElement) {
        operator_delete(local_a0.clocks.super_SmallVectorBase<const_slang::ast::TimingControl_*>.
                        data_);
      }
      lVar4 = lVar4 + 0x18;
    } while (sVar1 * 0x18 != lVar4);
  }
  expr_00 = local_b0;
  if (local_b0->defaultCase != (AssertionExpr *)0x0) {
    ast::AssertionExpr::
    visit<slang::analysis::ClockVisitor,slang::ast::TimingControl_const*&,slang::bitmask<slang::analysis::VisitFlags>&>
              (&local_68,local_b0->defaultCase,this,&local_b8,&local_bc);
    if (local_68.clocks.super_SmallVectorBase<const_slang::ast::TimingControl_*>.data_ !=
        (pointer)local_68.clocks.super_SmallVectorBase<const_slang::ast::TimingControl_*>.
                 firstElement) {
      operator_delete(local_68.clocks.super_SmallVectorBase<const_slang::ast::TimingControl_*>.data_
                     );
    }
  }
  pVVar3 = local_a8;
  inheritedClock(local_a8,this,&expr_00->super_AssertionExpr,local_b8,local_bc);
  return pVVar3;
}

Assistant:

VisitResult visit(const CaseAssertionExpr& expr, Clock outerClock, bitmask<VF> flags) {
        for (auto& item : expr.items)
            item.body->visit(*this, outerClock, flags);

        if (expr.defaultCase)
            expr.defaultCase->visit(*this, outerClock, flags);

        // Semantic leading clock is always inherited.
        return inheritedClock(expr, outerClock, flags);
    }